

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O3

int nh_http_parse(http_context_t *ctx)

{
  ulong uVar1;
  char *pcVar2;
  long lVar3;
  nh_http_version nVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  uint32_t uVar8;
  uint uVar9;
  ulong uVar10;
  
  uVar7 = (ctx->raw).index;
  if ((ctx->raw).length <= uVar7) {
    return 1;
  }
  do {
    switch(ctx->parse_state) {
    case PARSE_METHOD:
      lVar6 = 0;
      uVar9 = uVar7;
      while ((ctx->raw).buf[uVar9] != ' ') {
        lVar6 = lVar6 + -1;
        uVar9 = uVar9 + 1;
        if (lVar6 == -0x10) {
          return 0;
        }
      }
      if (-1 < (int)lVar6) {
        return 0;
      }
      (ctx->method).index = uVar7;
      (ctx->method).len = -(int)lVar6;
      ctx->parse_state = PARSE_PATH;
      goto LAB_001061ab;
    case PARSE_PATH:
      lVar6 = 0;
      uVar9 = uVar7;
      while ((ctx->raw).buf[uVar9] != ' ') {
        lVar6 = lVar6 + -1;
        uVar9 = uVar9 + 1;
        if (lVar6 == -0x800) {
          return 0;
        }
      }
      if (-1 < (int)lVar6) {
        return 0;
      }
      (ctx->path).index = uVar7;
      (ctx->path).len = -(int)lVar6;
      ctx->parse_state = PARSE_VERSION;
LAB_001061ab:
      uVar8 = (uVar7 - (int)lVar6) + 1;
LAB_001061af:
      (ctx->raw).index = uVar8;
      break;
    case PARSE_VERSION:
      pcVar2 = (ctx->raw).buf;
      if (pcVar2[uVar7] != 'H') {
        return 0;
      }
      uVar10 = 0xffffffffffffffff;
      do {
        if (uVar10 == 5) goto LAB_001060a3;
        lVar6 = uVar10 + 2;
        uVar1 = uVar10 + 1;
        lVar3 = uVar10 + (ulong)uVar7 + 2;
        uVar10 = uVar1;
      } while ("HTTP/1."[lVar6] == pcVar2[lVar3]);
      if (uVar1 < 6) {
        return 0;
      }
LAB_001060a3:
      (ctx->raw).index = uVar7 + 7;
      nVar4 = HTTP_1_0;
      if (pcVar2[uVar7 + 7] != '0') {
        if (pcVar2[uVar7 + 7] != '1') {
          return 0;
        }
        nVar4 = HTTP_1_1;
      }
      ctx->version = nVar4;
      ctx->parse_state = PARSE_LINE_END;
      uVar8 = uVar7 + 8;
      goto LAB_001061af;
    case PARSE_HEADER:
      iVar5 = nh_http_parse_consume_header(ctx);
      if (iVar5 == 0) {
        return 0;
      }
      ctx->parse_state = PARSE_LINE_END;
      break;
    case PARSE_SECOND_LINE_END:
      pcVar2 = (ctx->raw).buf;
      if ((pcVar2[uVar7] == '\r') && (pcVar2[(ulong)uVar7 + 1] == '\n')) {
        (ctx->raw).index = uVar7 + 2;
        ctx->parse_state = PARSE_BODY;
        nh_http_parse_get_body_len(ctx);
        goto switchD_0010603b_caseD_5;
      }
      ctx->parse_state = PARSE_HEADER;
      break;
    case PARSE_BODY:
switchD_0010603b_caseD_5:
      iVar5 = nh_http_parse_consume_body(ctx);
      if (iVar5 != 0) {
        ctx->parse_state = PARSE_DONE;
      }
      break;
    case PARSE_LINE_END:
      pcVar2 = (ctx->raw).buf;
      if (pcVar2[uVar7] != '\r') {
        return 0;
      }
      if (pcVar2[(ulong)uVar7 + 1] != '\n') {
        return 0;
      }
      (ctx->raw).index = uVar7 + 2;
      ctx->parse_state = PARSE_SECOND_LINE_END;
      break;
    case PARSE_DONE:
      goto LAB_001061cd;
    }
    uVar7 = (ctx->raw).index;
  } while (uVar7 < (ctx->raw).length);
LAB_001061cd:
  return 1;
}

Assistant:

int nh_http_parse(http_context_t *ctx) {
    //         Request       = Request-Line
    //                        *(( general-header
    //                         | request-header
    //                         | entity-header ) CRLF)
    //                        CRLF
    //                        [ message-body ]
    //
    // Request-Line   = Method SP Request-URI SP HTTP-Version CRLF
    nh_stream_t *stream = &ctx->raw;
    int offset;
    while (stream->index < stream->length) {
        switch (ctx->parse_state) {
            case PARSE_METHOD:
                if ((offset = nh_stream_find_next(stream, ' ', 16)) <= 0) return 0;
                ctx->method = (nh_anchor_t) {.index = stream->index, .len = offset};
                ctx->parse_state = PARSE_PATH;
                stream->index += offset + 1;
                break;
            case PARSE_PATH:
                if ((offset = nh_stream_find_next(stream, ' ', 2048)) <= 0) return 0;
                ctx->path = (nh_anchor_t) {.index = stream->index, .len = offset};
                ctx->parse_state = PARSE_VERSION;
                stream->index += offset + 1;
                break;
            case PARSE_VERSION:
                if (!nh_string_cmp("HTTP/1.", &stream->buf[stream->index], 7)) return 0;
                stream->index += 7;
                switch (stream->buf[stream->index]) {
                    case '0':
                        ctx->version = HTTP_1_0;
                        break;
                    case '1':
                        ctx->version = HTTP_1_1;
                        break;
                    default:
                        return 0;
                }
                ctx->parse_state = PARSE_LINE_END;
                stream->index += 1;
                break;
            case PARSE_LINE_END:
                if (!nh_string_cmp("\r\n", &stream->buf[stream->index], 2)) return 0;
                stream->index += 2;
                ctx->parse_state = PARSE_SECOND_LINE_END;
                break;
            case PARSE_SECOND_LINE_END:
                if (!nh_string_cmp("\r\n", &stream->buf[stream->index], 2)) {
                    ctx->parse_state = PARSE_HEADER;
                    break;
                }
                // parse body
                stream->index += 2;
                ctx->parse_state = PARSE_BODY;
                // get body length before consume body
                nh_http_parse_get_body_len(ctx);
                // fallthrough
            case PARSE_BODY:
                if (nh_http_parse_consume_body(ctx)) ctx->parse_state = PARSE_DONE;
                break;
            case PARSE_HEADER:
                if (!nh_http_parse_consume_header(ctx)) return 0;
                ctx->parse_state = PARSE_LINE_END;
                break;
            case PARSE_DONE:
                return 1;
        }
    }
    return 1;
}